

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenBinarySchemaTypeDef(CppGenerator *this,StructDef *struct_def)

{
  allocator<char> local_99;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  if ((struct_def != (StructDef *)0x0) &&
     (((this->opts_).super_IDLOptions.binary_schema_gen_embed & 1U) != 0)) {
    local_18 = struct_def;
    struct_def_local = (StructDef *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
    BaseGenerator::WrapInNameSpace
              (&local_78,&this->super_BaseGenerator,&struct_def->super_Definition,&local_98);
    std::operator+(&local_58,"  typedef ",&local_78);
    std::operator+(&local_38,&local_58,"BinarySchema BinarySchema;");
    CodeWriter::operator+=(&this->code_,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  return;
}

Assistant:

void GenBinarySchemaTypeDef(const StructDef *struct_def) {
    if (struct_def && opts_.binary_schema_gen_embed) {
      code_ += "  typedef " + WrapInNameSpace(*struct_def) +
               "BinarySchema BinarySchema;";
    }
  }